

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2min_distance_targets.cc
# Opt level: O0

bool __thiscall
S2MinDistanceCellUnionTarget::VisitContainingShapes
          (S2MinDistanceCellUnionTarget *this,S2ShapeIndex *query_index,ShapeVisitor *visitor)

{
  bool bVar1;
  reference pSVar2;
  S2Point local_80;
  undefined1 local_68 [8];
  S2MinDistancePointTarget target;
  S2CellId cell_id;
  const_iterator __end1;
  const_iterator __begin1;
  S2CellUnion *__range1;
  ShapeVisitor *visitor_local;
  S2ShapeIndex *query_index_local;
  S2MinDistanceCellUnionTarget *this_local;
  
  __end1 = S2CellUnion::begin(&this->cell_union_);
  cell_id.id_ = (uint64)S2CellUnion::end(&this->cell_union_);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<const_S2CellId_*,_std::vector<S2CellId,_std::allocator<S2CellId>_>_>
                                     *)&cell_id), bVar1) {
    pSVar2 = __gnu_cxx::
             __normal_iterator<const_S2CellId_*,_std::vector<S2CellId,_std::allocator<S2CellId>_>_>
             ::operator*(&__end1);
    target.point_.c_[2] = (VType)pSVar2->id_;
    S2CellId::ToPoint(&local_80,(S2CellId *)(target.point_.c_ + 2));
    S2MinDistancePointTarget::S2MinDistancePointTarget
              ((S2MinDistancePointTarget *)local_68,&local_80);
    bVar1 = S2MinDistancePointTarget::VisitContainingShapes
                      ((S2MinDistancePointTarget *)local_68,query_index,visitor);
    if (!bVar1) {
      this_local._7_1_ = 0;
    }
    S2MinDistancePointTarget::~S2MinDistancePointTarget((S2MinDistancePointTarget *)local_68);
    if (!bVar1) goto LAB_004af895;
    __gnu_cxx::
    __normal_iterator<const_S2CellId_*,_std::vector<S2CellId,_std::allocator<S2CellId>_>_>::
    operator++(&__end1);
  }
  this_local._7_1_ = 1;
LAB_004af895:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool S2MinDistanceCellUnionTarget::VisitContainingShapes(
    const S2ShapeIndex& query_index, const ShapeVisitor& visitor) {
  for (S2CellId cell_id : cell_union_) {
    S2MinDistancePointTarget target(cell_id.ToPoint());
    if (!target.VisitContainingShapes(query_index, visitor)) {
      return false;
    }
  }
  return true;
}